

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

CheckState qvariant_cast<Qt::CheckState>(QVariant *v)

{
  bool bVar1;
  CheckState *pCVar2;
  QMetaType *pQVar3;
  void *pvVar4;
  long in_FS_OFFSET;
  CheckState t;
  QMetaType targetType;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Private *in_stack_ffffffffffffffc0;
  CheckState local_2c;
  CheckState local_1c;
  QMetaTypeInterface *local_18;
  QMetaTypeInterface *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QMetaTypeInterface *)QMetaType::fromType<Qt::CheckState>();
  local_18 = (QMetaTypeInterface *)QVariant::Private::type(in_stack_ffffffffffffffc0);
  bVar1 = operator==((QMetaType *)in_stack_ffffffffffffffc0,
                     (QMetaType *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (bVar1) {
    pCVar2 = QVariant::Private::get<Qt::CheckState>((Private *)0x856c8f);
    local_2c = *pCVar2;
  }
  else {
    local_1c = Unchecked;
    pQVar3 = (QMetaType *)QVariant::metaType();
    pvVar4 = QVariant::constData((QVariant *)0x856cb8);
    QMetaType::convert(pQVar3,pvVar4,(QMetaType *)local_10,&local_1c);
    local_2c = local_1c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}